

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O2

EC_T_BOOL PrintSlaveInfos(EC_T_DWORD dwInstanceID,CAtEmLogging *poLog)

{
  EC_T_DWORD EVar1;
  EC_T_BYTE EVar2;
  int iVar3;
  EC_T_CHAR *pEVar4;
  char *pcVar5;
  short sVar6;
  ulong uVar7;
  EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
  EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;
  
  uVar7 = 0;
  sVar6 = 0;
  while( true ) {
    if ((short)uVar7 == -1) {
      return 1;
    }
    iVar3 = emGetBusSlaveInfo(dwInstanceID,0,sVar6,&oBusSlaveInfo);
    if (iVar3 != 0) break;
    CAtEmLogging::LogMsg
              (poLog,
               "******************************************************************************");
    CAtEmLogging::LogMsg(poLog,"Slave ID............: 0x%08X",(ulong)oBusSlaveInfo.dwSlaveId);
    CAtEmLogging::LogMsg(poLog,"Bus Index...........: %d",uVar7);
    CAtEmLogging::LogMsg(poLog,"Bus AutoInc Address.: 0x%04x",(ulong)oBusSlaveInfo.wAutoIncAddress);
    CAtEmLogging::LogMsg
              (poLog,"Bus Station Address.: 0x%04x (%4d)",(ulong)oBusSlaveInfo.wStationAddress);
    CAtEmLogging::LogMsg
              (poLog,"Bus Alias Address...: 0x%04x (%4d)",(ulong)oBusSlaveInfo.wAliasAddress);
    EVar1 = oBusSlaveInfo.dwVendorId;
    pEVar4 = SlaveVendorText(oBusSlaveInfo.dwVendorId);
    CAtEmLogging::LogMsg(poLog,"Vendor ID...........: 0x%08X = %s",(ulong)EVar1,pEVar4);
    EVar1 = oBusSlaveInfo.dwProductCode;
    pEVar4 = SlaveProdCodeText(oBusSlaveInfo.dwVendorId,oBusSlaveInfo.dwProductCode);
    CAtEmLogging::LogMsg(poLog,"Product Code........: 0x%08X = %s",(ulong)EVar1,pEVar4);
    CAtEmLogging::LogMsg
              (poLog,"Revision............: 0x%08X   Serial Number: %d",
               (ulong)oBusSlaveInfo.dwRevisionNumber,(ulong)oBusSlaveInfo.dwSerialNumber);
    EVar2 = oBusSlaveInfo.byESCType;
    pEVar4 = ESCTypeText(oBusSlaveInfo.byESCType);
    CAtEmLogging::LogMsg
              (poLog,"ESC Type............: %s (0x%x)  Revision: %d  Build: %d",pEVar4,(ulong)EVar2,
               (ulong)oBusSlaveInfo.byESCRevision,(ulong)oBusSlaveInfo.wESCBuild);
    pcVar5 = "yes";
    if ((oBusSlaveInfo.wPortState & 1) == 0) {
      pcVar5 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port A: %s (to 0x%08X)",pcVar5,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[0]);
    pcVar5 = "yes";
    if ((oBusSlaveInfo.wPortState & 8) == 0) {
      pcVar5 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port D: %s (to 0x%08X)",pcVar5,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[3]);
    pcVar5 = "yes";
    if ((oBusSlaveInfo.wPortState & 2) == 0) {
      pcVar5 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port B: %s (to 0x%08X)",pcVar5,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[1]);
    pcVar5 = "yes";
    if ((oBusSlaveInfo.wPortState & 4) == 0) {
      pcVar5 = "no ";
    }
    CAtEmLogging::LogMsg
              (poLog,"Connection at Port C: %s (to 0x%08X)",pcVar5,
               (ulong)oBusSlaveInfo.adwPortSlaveIds[2]);
    pcVar5 = "yes";
    if (oBusSlaveInfo.bLineCrossed == 0) {
      pcVar5 = "no ";
    }
    CAtEmLogging::LogMsg(poLog,"Line Crossed........: %s",pcVar5);
    iVar3 = emGetCfgSlaveInfo(dwInstanceID,1,oBusSlaveInfo.wStationAddress,&oCfgSlaveInfo);
    if (iVar3 == 0) {
      CAtEmLogging::LogMsg
                (poLog,"Cfg Station Address.: 0x%04x (%4d)",(ulong)oCfgSlaveInfo.wStationAddress);
      if (oCfgSlaveInfo.dwPdSizeIn != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN    Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn & 7));
      }
      if (oCfgSlaveInfo.dwPdSizeOut != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT   Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut & 7));
      }
      if (oCfgSlaveInfo.dwPdSizeIn2 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  2 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn2 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn2 & 7));
      }
      if (oCfgSlaveInfo.dwPdSizeOut2 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 2 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut2 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut2 & 7))
        ;
      }
      if (oCfgSlaveInfo.dwPdSizeIn3 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  3 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn3 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn3 & 7));
      }
      if (oCfgSlaveInfo.dwPdSizeOut3 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 3 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut3 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut3 & 7))
        ;
      }
      if (oCfgSlaveInfo.dwPdSizeIn4 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD IN  4 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsIn4 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsIn4 & 7));
      }
      if (oCfgSlaveInfo.dwPdSizeOut4 != 0) {
        CAtEmLogging::LogMsg
                  (poLog,"PD OUT 4 Byte.Bit offset: %d.%d   Size: %d bits",
                   (ulong)(oCfgSlaveInfo.dwPdOffsOut4 >> 3),(ulong)(oCfgSlaveInfo.dwPdOffsOut4 & 7))
        ;
      }
    }
    sVar6 = sVar6 + -1;
    uVar7 = (ulong)((int)uVar7 + 1);
  }
  return 1;
}

Assistant:

EC_T_BOOL PrintSlaveInfos
    (EC_T_DWORD     dwInstanceID
    ,CAtEmLogging*  poLog)
{
EC_T_DWORD dwRes           = EC_E_ERROR;
EC_T_WORD  wAutoIncAddress = 0;

    /* get information about all bus slaves */
    for (wAutoIncAddress = 0; wAutoIncAddress != 1; wAutoIncAddress--)
    {
    EC_T_BUS_SLAVE_INFO oBusSlaveInfo;
    EC_T_CFG_SLAVE_INFO oCfgSlaveInfo;

        /* get bus slave information */
        dwRes = emGetBusSlaveInfo(dwInstanceID, EC_FALSE, wAutoIncAddress, &oBusSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            break;
        }
        LogMsg("******************************************************************************");
        LogMsg("Slave ID............: 0x%08X", oBusSlaveInfo.dwSlaveId);
        LogMsg("Bus Index...........: %d", (EC_T_WORD)(0-wAutoIncAddress));
        LogMsg("Bus AutoInc Address.: 0x%04x",       oBusSlaveInfo.wAutoIncAddress, oBusSlaveInfo.wAutoIncAddress);
        LogMsg("Bus Station Address.: 0x%04x (%4d)", oBusSlaveInfo.wStationAddress, oBusSlaveInfo.wStationAddress);
        LogMsg("Bus Alias Address...: 0x%04x (%4d)", oBusSlaveInfo.wAliasAddress,   oBusSlaveInfo.wAliasAddress);
        LogMsg("Vendor ID...........: 0x%08X = %s", oBusSlaveInfo.dwVendorId, SlaveVendorText((T_eEtherCAT_Vendor)oBusSlaveInfo.dwVendorId));
        LogMsg("Product Code........: 0x%08X = %s", oBusSlaveInfo.dwProductCode, SlaveProdCodeText((T_eEtherCAT_Vendor)oBusSlaveInfo.dwVendorId, (T_eEtherCAT_ProductCode)oBusSlaveInfo.dwProductCode));
        LogMsg("Revision............: 0x%08X   Serial Number: %d", oBusSlaveInfo.dwRevisionNumber, oBusSlaveInfo.dwSerialNumber);
        LogMsg("ESC Type............: %s (0x%x)  Revision: %d  Build: %d", ESCTypeText(oBusSlaveInfo.byESCType), oBusSlaveInfo.byESCType, oBusSlaveInfo.byESCRevision, oBusSlaveInfo.wESCBuild);
        LogMsg("Connection at Port A: %s (to 0x%08X)", ((1<<0)==(oBusSlaveInfo.wPortState & (1<<0)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[0]);
        LogMsg("Connection at Port D: %s (to 0x%08X)", ((1<<3)==(oBusSlaveInfo.wPortState & (1<<3)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[3]);
        LogMsg("Connection at Port B: %s (to 0x%08X)", ((1<<1)==(oBusSlaveInfo.wPortState & (1<<1)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[1]);
        LogMsg("Connection at Port C: %s (to 0x%08X)", ((1<<2)==(oBusSlaveInfo.wPortState & (1<<2)))? "yes": "no ", oBusSlaveInfo.adwPortSlaveIds[2]);
        LogMsg("Line Crossed........: %s", (oBusSlaveInfo.bLineCrossed)? "yes": "no ");

        /* get cfg slave information (matching bus slave) */
        dwRes = emGetCfgSlaveInfo(dwInstanceID, EC_TRUE, oBusSlaveInfo.wStationAddress, &oCfgSlaveInfo);
        if (EC_E_NOERROR != dwRes)
        {
            continue;
        }
        LogMsg("Cfg Station Address.: 0x%04x (%4d)", oCfgSlaveInfo.wStationAddress, oCfgSlaveInfo.wStationAddress);
        if (0 != oCfgSlaveInfo.dwPdSizeIn)
        {
            LogMsg("PD IN    Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn/8,  oCfgSlaveInfo.dwPdOffsIn%8,  oCfgSlaveInfo.dwPdSizeIn);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut)
        {
            LogMsg("PD OUT   Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut/8, oCfgSlaveInfo.dwPdOffsOut%8, oCfgSlaveInfo.dwPdSizeOut);
        }

        if (0 != oCfgSlaveInfo.dwPdSizeIn2)
        {
            LogMsg("PD IN  2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn2/8,  oCfgSlaveInfo.dwPdOffsIn2%8,  oCfgSlaveInfo.dwPdSizeIn2);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut2)
        {
            LogMsg("PD OUT 2 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut2/8, oCfgSlaveInfo.dwPdOffsOut2%8, oCfgSlaveInfo.dwPdSizeOut2);
        }

        if (0 != oCfgSlaveInfo.dwPdSizeIn3)
        {
            LogMsg("PD IN  3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn3/8,  oCfgSlaveInfo.dwPdOffsIn3%8,  oCfgSlaveInfo.dwPdSizeIn3);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut3)
        {
            LogMsg("PD OUT 3 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut3/8, oCfgSlaveInfo.dwPdOffsOut3%8, oCfgSlaveInfo.dwPdSizeOut3);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeIn4)
        {
            LogMsg("PD IN  4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsIn4/8,  oCfgSlaveInfo.dwPdOffsIn4%8,  oCfgSlaveInfo.dwPdSizeIn4);
        }
        if (0 != oCfgSlaveInfo.dwPdSizeOut4)
        {
            LogMsg("PD OUT 4 Byte.Bit offset: %d.%d   Size: %d bits", oCfgSlaveInfo.dwPdOffsOut4/8, oCfgSlaveInfo.dwPdOffsOut4%8, oCfgSlaveInfo.dwPdSizeOut4);
        }
    }
    return EC_TRUE;
}